

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemViewPrivate::layoutChanged(QAbstractItemViewPrivate *this)

{
  QObject *obj;
  ulong uVar1;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemView *q;
  QAccessibleTableModelChangeEvent accessibleEvent;
  undefined8 in_stack_ffffffffffffffb8;
  QAbstractItemViewPrivate *this_00;
  QAccessibleTableModelChangeEvent local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  doDelayedItemsLayout(in_RDI,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  obj = (QObject *)q_func(in_RDI);
  uVar1 = QAccessible::isActive();
  if ((uVar1 & 1) != 0) {
    memset(local_38,0xaa,0x30);
    QAccessibleTableModelChangeEvent::QAccessibleTableModelChangeEvent
              ((QAccessibleTableModelChangeEvent *)this_00,obj,
               (ModelChangeType)((ulong)in_RDI >> 0x20));
    QAccessible::updateAccessibility((QAccessibleEvent *)local_38);
    QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent(local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::layoutChanged()
{
    doDelayedItemsLayout();
#if QT_CONFIG(accessibility)
    Q_Q(QAbstractItemView);
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(q, QAccessibleTableModelChangeEvent::ModelReset);
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
}